

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O2

int32_t WebRtcAgc_ProcessAnalog
                  (void *state,int32_t inMicLevel,int32_t *outMicLevel,int16_t vadLogRatio,
                  int16_t echo,uint8_t *saturationWarning)

{
  short sVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined6 in_register_0000000a;
  uint uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined6 in_register_00000082;
  ulong uVar12;
  short sVar13;
  short sVar14;
  uint8_t saturated;
  uint local_70;
  short local_6a;
  int local_68;
  undefined4 local_64;
  int16_t index_1;
  int16_t index;
  uint local_5c;
  ulong local_58;
  uint local_4c;
  uint local_48;
  undefined4 local_44;
  int *local_40;
  int *local_38;
  
  saturated = '\0';
  local_70 = inMicLevel << (*(byte *)((long)state + 0x15c) & 0x1f);
  uVar5 = *(uint *)((long)state + 0x144);
  if ((int)uVar5 < (int)local_70) {
    return -1;
  }
  iVar8 = *(int *)((long)state + 0x14c);
  if ((int)local_70 < iVar8) {
    return -1;
  }
  if (*(short *)((long)state + 0x122) == 0) {
    *(undefined2 *)((long)state + 0x122) = 1;
    uVar3 = ((*(int *)((long)state + 0x140) - iVar8) * 0x33 >> 9) + iVar8;
    if (((int)local_70 < (int)uVar3) && (*(short *)((long)state + 8) == 1)) {
      local_70 = uVar3;
    }
    *(uint *)((long)state + 0x13c) = local_70;
  }
  uVar3 = *(uint *)((long)state + 0x13c);
  local_58 = (ulong)uVar3;
  uVar9 = local_70;
  if (((local_70 != uVar5) || (uVar9 = uVar5, uVar4 = uVar3, (int)uVar3 <= (int)uVar5)) &&
     (uVar4 = local_70, uVar9 != uVar3)) {
    if ((int)uVar9 < *(int *)((long)state + 0x150)) {
      uVar4 = ((*(int *)((long)state + 0x140) - iVar8) * 0x33 >> 9) + iVar8;
      local_58 = (ulong)uVar4;
      *(uint *)((long)state + 0x13c) = uVar4;
    }
    else if ((uVar9 != uVar3) && (uVar4 = uVar3, *(int *)((long)state + 0x158) != inMicLevel)) {
      *(uint *)((long)state + 0x13c) = uVar9;
      local_58 = (ulong)uVar9;
      uVar4 = local_70;
    }
  }
  local_70 = uVar4;
  local_40 = (int *)((long)state + 0x13c);
  local_64 = (undefined4)CONCAT62(in_register_0000000a,vadLogRatio);
  if (*(int *)((long)state + 0x140) < (int)local_58) {
    *(int *)((long)state + 0x140) = (int)local_58;
  }
  *(int32_t *)((long)state + 0x158) = inMicLevel;
  WebRtcAgc_SaturationCtrl((LegacyAgc *)state,&saturated,(int32_t *)((long)state + 0xc4));
  if (saturated == '\x01') {
    *(int *)((long)state + 0x6c) = (*(int *)((long)state + 0x6c) / 8) * 7;
    *(undefined4 *)((long)state + 0x154) = *(undefined4 *)((long)state + 0x13c);
    local_70 = ((uint)(((int)local_58 - *(int *)((long)state + 0x14c)) * 0x7397) >> 0xf) +
               *(int *)((long)state + 0x14c);
    uVar5 = (int)local_58 - 2;
    if ((int)uVar5 <= (int)local_70) {
      local_70 = uVar5;
    }
    *(uint *)((long)state + 0x13c) = local_70;
    if ((int)local_70 < *(int *)((long)state + 0x150)) {
      *saturationWarning = '\x01';
    }
    *(undefined4 *)((long)state + 0x11e) = 0xff9c;
    *(undefined4 *)((long)state + 0x70) = 0;
    *(undefined8 *)((long)state + 0x126) = 0x2080154;
    *(undefined8 *)((long)state + 0x5c) = *(undefined8 *)((long)state + 0x20);
  }
  local_44 = (undefined4)CONCAT62(in_register_00000082,echo);
  local_38 = outMicLevel;
  WebRtcAgc_ZeroCtrl((LegacyAgc *)state,(int32_t *)&local_70,(int32_t *)((long)state + 0xc4));
  WebRtcAgc_SpeakerInactiveCtrl((LegacyAgc *)state);
  sVar14 = *(short *)((long)state + 0x114);
  sVar13 = *(short *)((long)state + 0x118);
  iVar8 = (int)local_58;
  local_4c = iVar8 + 1;
  local_48 = iVar8 + 2;
  uVar3 = iVar8 - 1;
  uVar12 = local_58;
  uVar5 = local_70;
  uVar11 = local_64;
  local_6a = sVar13;
  local_5c = uVar3;
  for (lVar10 = 0; iVar8 = (int)uVar12, lVar10 != 5; lVar10 = lVar10 + 1) {
    iVar6 = *(int *)((long)state + lVar10 * 4 + 0x9c);
    *(int *)((long)state + 100) =
         *(int *)((long)state + 100) +
         (iVar6 - *(int *)((long)state + (long)sVar14 * 4 + 0x74) >> 3);
    *(int *)((long)state + (long)sVar14 * 4 + 0x74) = iVar6;
    sVar14 = sVar14 + 1;
    if (sVar14 == 10) {
      sVar14 = 0;
    }
    iVar6 = (iVar6 - *(int *)((long)state + 0x68) >> 6) + *(int *)((long)state + 0x68);
    *(int *)((long)state + 0x68) = iVar6;
    if (sVar13 < (short)uVar11) {
      sVar2 = *(short *)((long)state + 0x12a);
      if (sVar2 < 0xfa) {
        *(short *)((long)state + 0x12a) = sVar2 + 2;
        if (*(int *)((long)state + 0x70) < iVar6) {
          *(int *)((long)state + 0x70) = iVar6;
        }
      }
      else if (sVar2 == 0xfa) {
        *(undefined2 *)((long)state + 0x12a) = 0xfc;
        *(int *)((long)state + 0x6c) = (*(int *)((long)state + 0x70) >> 3) * 10;
      }
      iVar6 = (*(int *)((long)state + 100) - *(int *)((long)state + 0x6c) >> 10) +
              *(int *)((long)state + 0x6c);
      *(int *)((long)state + 0x6c) = iVar6;
      if (*(int *)((long)state + 0x30) < iVar6) {
        sVar2 = *(short *)((long)state + 0x11e) + 2;
        *(short *)((long)state + 0x11e) = sVar2;
        *(undefined2 *)((long)state + 0x11c) = 0;
        *(undefined2 *)((long)state + 0x120) = 0;
        if (*(short *)((long)state + 0x126) < sVar2) {
          *(undefined2 *)((long)state + 0x11e) = 0;
          *(int *)((long)state + 0x6c) = (iVar6 >> 6) * 0x35;
          iVar7 = (*(int *)((long)state + 0x140) * 0xf + *(int *)((long)state + 0x13c)) / 0x10;
          iVar6 = *(int *)((long)state + 0x144);
          if (*(int *)((long)state + 0x144) < iVar7) {
            iVar6 = iVar7;
          }
          *(int *)((long)state + 0x140) = iVar6;
          *(int *)((long)state + 0x154) = *(int *)((long)state + 0x13c);
          uVar5 = ((uVar5 - *(int *)((long)state + 0x14c)) * 0x799a >> 0xf) +
                  *(int *)((long)state + 0x14c);
          if (iVar8 <= (int)uVar5) {
            uVar5 = uVar3;
          }
          *(uint *)((long)state + 0x13c) = uVar5;
          *(undefined2 *)((long)state + 0x12a) = 0;
          *(undefined4 *)((long)state + 0x70) = 0;
        }
      }
      else if (*(int *)((long)state + 0x5c) < iVar6) {
        sVar2 = *(short *)((long)state + 0x11e) + 2;
        *(short *)((long)state + 0x11e) = sVar2;
        *(undefined2 *)((long)state + 0x11c) = 0;
        *(undefined2 *)((long)state + 0x120) = 0;
        if (*(short *)((long)state + 0x128) < sVar2) {
          *(undefined2 *)((long)state + 0x11e) = 0;
          *(int *)((long)state + 0x6c) = (iVar6 / 0x40) * 0x35;
          iVar7 = (*(int *)((long)state + 0x140) * 0xf + *(int *)((long)state + 0x13c)) / 0x10;
          iVar6 = *(int *)((long)state + 0x144);
          if (*(int *)((long)state + 0x144) < iVar7) {
            iVar6 = iVar7;
          }
          *(int *)((long)state + 0x140) = iVar6;
          *(int *)((long)state + 0x154) = *(int *)((long)state + 0x13c);
          uVar5 = ((uVar5 - *(int *)((long)state + 0x14c)) * 0x7b85 >> 0xf) +
                  *(int *)((long)state + 0x14c);
          if (iVar8 <= (int)uVar5) {
            uVar5 = uVar3;
          }
LAB_0012b079:
          *(uint *)((long)state + 0x13c) = uVar5;
        }
      }
      else if (iVar6 < *(int *)((long)state + 0x34)) {
        *(undefined4 *)((long)state + 0x11e) = 0;
        sVar2 = (short)*(undefined4 *)((long)state + 0x11c) + 2;
        *(short *)((long)state + 0x11c) = sVar2;
        if (*(short *)((long)state + 0x126) < sVar2) {
          *(undefined2 *)((long)state + 0x11c) = 0;
          local_68 = *(int *)((long)state + 0x14c);
          iVar7 = uVar5 - local_68;
          sVar13 = 0x4000;
          iVar8 = *(int *)((long)state + 0x148) - local_68;
          if (iVar8 != 0) {
            sVar13 = (short)((iVar7 * 0x4000) / iVar8);
          }
          WebRtcAgc_ExpCurve(sVar13,&index);
          sVar2 = kOffset1[index];
          sVar1 = kSlope1[index];
          *(int *)((long)state + 0x6c) = (iVar6 / 0x40) * 0x43;
          uVar5 = ((uint)(iVar7 * (short)(sVar2 - (short)((uint)((int)sVar1 * (int)sVar13) >> 0xd)))
                  >> 0xe) + local_68;
          if ((int)uVar5 <= (int)local_48) {
            uVar5 = local_48;
          }
          *(uint *)((long)state + 0x13c) = uVar5;
          uVar12 = local_58;
          sVar13 = local_6a;
          uVar3 = local_5c;
          uVar11 = local_64;
        }
      }
      else {
        if (*(int *)((long)state + 0x60) <= iVar6) {
          if (*(short *)((long)state + 0x120) < 0xfa1) {
            *(short *)((long)state + 0x120) = *(short *)((long)state + 0x120) + 2;
          }
          else {
            *(undefined4 *)((long)state + 0x126) = 0x3e801f4;
            *(undefined8 *)((long)state + 0x5c) = *(undefined8 *)((long)state + 0x28);
          }
          *(undefined4 *)((long)state + 0x11c) = 0;
          goto LAB_0012b079;
        }
        *(undefined4 *)((long)state + 0x11e) = 0;
        sVar2 = (short)*(undefined4 *)((long)state + 0x11c) + 2;
        *(short *)((long)state + 0x11c) = sVar2;
        if (*(short *)((long)state + 0x128) < sVar2) {
          *(undefined2 *)((long)state + 0x11c) = 0;
          local_68 = *(int *)((long)state + 0x14c);
          iVar7 = uVar5 - local_68;
          sVar13 = 0x4000;
          iVar8 = *(int *)((long)state + 0x148) - local_68;
          if (iVar8 != 0) {
            sVar13 = (short)((iVar7 * 0x4000) / iVar8);
          }
          WebRtcAgc_ExpCurve(sVar13,&index_1);
          sVar2 = kOffset2[index_1];
          sVar1 = kSlope2[index_1];
          *(int *)((long)state + 0x6c) = (iVar6 / 0x40) * 0x43;
          uVar5 = ((uint)(iVar7 * (short)(sVar2 - (short)((uint)((int)sVar1 * (int)sVar13) >> 0xd)))
                  >> 0xe) + local_68;
          if ((int)uVar5 <= (int)local_58) {
            uVar5 = local_4c;
          }
          *(uint *)((long)state + 0x13c) = uVar5;
          uVar12 = local_58;
          sVar13 = local_6a;
          uVar3 = local_5c;
          uVar11 = local_64;
        }
      }
    }
  }
  *(short *)((long)state + 0x114) = sVar14;
  if ((short)local_44 == 1) {
    iVar6 = *local_40;
  }
  else {
    iVar6 = *(int *)((long)state + 0x13c);
    if (0x1f3e < (ushort)((short)*(undefined4 *)((long)state + 300) - 1U)) goto LAB_0012b0d2;
  }
  if (iVar8 < iVar6) {
    *local_40 = iVar8;
    iVar6 = iVar8;
  }
LAB_0012b0d2:
  iVar8 = *(int *)((long)state + 0x140);
  if ((*(int *)((long)state + 0x140) < iVar6) ||
     (iVar8 = *(int *)((long)state + 0x150), iVar6 < *(int *)((long)state + 0x150))) {
    iVar6 = iVar8;
    *local_40 = iVar6;
  }
  iVar8 = *(int *)((long)state + 0x144);
  if (iVar6 < *(int *)((long)state + 0x144)) {
    iVar8 = iVar6;
  }
  *local_38 = iVar8 >> (*(byte *)((long)state + 0x15c) & 0x1f);
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessAnalog(void *state, int32_t inMicLevel, int32_t *outMicLevel, int16_t vadLogRatio,
                                int16_t echo, uint8_t *saturationWarning) {
    uint32_t tmpU32;
    int32_t Rxx16w32, tmp32;
    int32_t inMicLevelTmp, lastMicVol;
    int16_t i;
    uint8_t saturated = 0;
    LegacyAgc *stt;

    stt = (LegacyAgc *) state;
    inMicLevelTmp = inMicLevel << stt->scale;

    if (inMicLevelTmp > stt->maxAnalog) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: micLvl > maxAnalog\n", stt->fcount);
#endif
        return -1;
    } else if (inMicLevelTmp < stt->minLevel) {
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel\n", stt->fcount);
#endif
        return -1;
    }

    if (stt->firstCall == 0) {
        int32_t tmpVol;
        stt->firstCall = 1;
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        tmpVol = (stt->minLevel + tmp32);

        /* If the mic level is very low at start, increase it! */
        if ((inMicLevelTmp < tmpVol) && (stt->agcMode == kAgcModeAdaptiveAnalog)) {
            inMicLevelTmp = tmpVol;
        }
        stt->micVol = inMicLevelTmp;
    }

    /* Set the mic level to the previous output value if there is digital input
     * gain */
    if ((inMicLevelTmp == stt->maxAnalog) && (stt->micVol > stt->maxAnalog)) {
        inMicLevelTmp = stt->micVol;
    }

    /* If the mic level was manually changed to a very low value raise it! */
    if ((inMicLevelTmp != stt->micVol) && (inMicLevelTmp < stt->minOutput)) {
        tmp32 = ((stt->maxLevel - stt->minLevel) * 51) >> 9;
        inMicLevelTmp = (stt->minLevel + tmp32);
        stt->micVol = inMicLevelTmp;
#ifdef MIC_LEVEL_FEEDBACK
        // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt,
                "\tAGC->ProcessAnalog, frame %d: micLvl < minLevel by manual"
                " decrease, raise vol\n",
                stt->fcount);
#endif
    }

    if (inMicLevelTmp != stt->micVol) {
        if (inMicLevel == stt->lastInMicLevel) {
            // We requested a volume adjustment, but it didn't occur. This is
            // probably due to a coarse quantization of the volume slider.
            // Restore the requested value to prevent getting stuck.
            inMicLevelTmp = stt->micVol;
        } else {
            // As long as the value changed, update to match.
            stt->micVol = inMicLevelTmp;
        }
    }

    if (inMicLevelTmp > stt->maxLevel) {
        // Always allow the user to raise the volume above the maxLevel.
        stt->maxLevel = inMicLevelTmp;
    }

    // Store last value here, after we've taken care of manual updates etc.
    stt->lastInMicLevel = inMicLevel;
    lastMicVol = stt->micVol;

    /* Checks if the signal is saturated. Also a check if individual samples
     * are larger than 12000 is done. If they are the counter for increasing
     * the volume level is set to -100ms
     */
    WebRtcAgc_SaturationCtrl(stt, &saturated, stt->env[0]);

    /* The AGC is always allowed to lower the level if the signal is saturated */
    if (saturated == 1) {
        /* Lower the recording level
         * Rxx160_LP is adjusted down because it is so slow it could
         * cause the AGC to make wrong decisions. */
        /* stt->Rxx160_LPw32 *= 0.875; */
        stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 8) * 7;

        stt->zeroCtrlMax = stt->micVol;

        /* stt->micVol *= 0.903; */
        tmp32 = inMicLevelTmp - stt->minLevel;
        tmpU32 = ((uint32_t)((uint32_t)(29591) * (uint32_t)(tmp32)));
        stt->micVol = (tmpU32 >> 15) + stt->minLevel;
        if (stt->micVol > lastMicVol - 2) {
            stt->micVol = lastMicVol - 2;
        }
        inMicLevelTmp = stt->micVol;

#ifdef WEBRTC_AGC_DEBUG_DUMP
        fprintf(stt->fpt, "\tAGC->ProcessAnalog, frame %d: saturated, micVol = %d\n", stt->fcount, stt->micVol);
#endif

        if (stt->micVol < stt->minOutput) {
            *saturationWarning = 1;
        }

        /* Reset counter for decrease of volume level to avoid
         * decreasing too much. The saturation control can still
         * lower the level if needed. */
        stt->msTooHigh = -100;

        /* Enable the control mechanism to ensure that our measure,
         * Rxx160_LP, is in the correct range. This must be done since
         * the measure is very slow. */
        stt->activeSpeech = 0;
        stt->Rxx16_LPw32Max = 0;

        /* Reset to initial values */
        stt->msecSpeechInnerChange = kMsecSpeechInner;
        stt->msecSpeechOuterChange = kMsecSpeechOuter;
        stt->changeToSlowMode = 0;

        stt->muteGuardMs = 0;

        stt->upperLimit = stt->startUpperLimit;
        stt->lowerLimit = stt->startLowerLimit;
#ifdef MIC_LEVEL_FEEDBACK
        // stt->numBlocksMicLvlSat = 0;
#endif
    }

    /* Check if the input speech is zero. If so the mic volume
     * is increased. On some computers the input is zero up as high
     * level as 17% */
    WebRtcAgc_ZeroCtrl(stt, &inMicLevelTmp, stt->env[0]);

    /* Check if the near end speaker is inactive.
     * If that is the case the VAD threshold is
     * increased since the VAD speech model gets
     * more sensitive to any sound after a long
     * silence.
     */
    WebRtcAgc_SpeakerInactiveCtrl(stt);

    for (i = 0; i < 5; i++) {
        /* Computed on blocks of 16 samples */

        Rxx16w32 = stt->Rxx16w32_array[0][i];

        /* Rxx160w32 in Q(-7) */
        tmp32 = (Rxx16w32 - stt->Rxx16_vectorw32[stt->Rxx16pos]) >> 3;
        stt->Rxx160w32 = stt->Rxx160w32 + tmp32;
        stt->Rxx16_vectorw32[stt->Rxx16pos] = Rxx16w32;

        /* Circular buffer */
        stt->Rxx16pos++;
        if (stt->Rxx16pos == RXX_BUFFER_LEN) {
            stt->Rxx16pos = 0;
        }

        /* Rxx16_LPw32 in Q(-4) */
        tmp32 = (Rxx16w32 - stt->Rxx16_LPw32) >> kAlphaShortTerm;
        stt->Rxx16_LPw32 = (stt->Rxx16_LPw32) + tmp32;

        if (vadLogRatio > stt->vadThreshold) {
            /* Speech detected! */

            /* Check if Rxx160_LP is in the correct range. If
             * it is too high/low then we set it to the maximum of
             * Rxx16_LPw32 during the first 200ms of speech.
             */
            if (stt->activeSpeech < 250) {
                stt->activeSpeech += 2;

                if (stt->Rxx16_LPw32 > stt->Rxx16_LPw32Max) {
                    stt->Rxx16_LPw32Max = stt->Rxx16_LPw32;
                }
            } else if (stt->activeSpeech == 250) {
                stt->activeSpeech += 2;
                tmp32 = stt->Rxx16_LPw32Max >> 3;
                stt->Rxx160_LPw32 = tmp32 * RXX_BUFFER_LEN;
            }

            tmp32 = (stt->Rxx160w32 - stt->Rxx160_LPw32) >> kAlphaLongTerm;
            stt->Rxx160_LPw32 = stt->Rxx160_LPw32 + tmp32;

            if (stt->Rxx160_LPw32 > stt->upperSecondaryLimit) {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechOuterChange) {
                    stt->msTooHigh = 0;

                    /* Lower the recording level */
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    tmp32 = stt->Rxx160_LPw32 >> 6;
                    stt->Rxx160_LPw32 = tmp32 * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.95 in Q15 */
                    tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)((uint32_t)(31130) * (uint32_t)(tmp32)));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1) {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

                    /* Enable the control mechanism to ensure that our measure,
                     * Rxx160_LP, is in the correct range.
                     */
                    stt->activeSpeech = 0;
                    stt->Rxx16_LPw32Max = 0;
#ifdef MIC_LEVEL_FEEDBACK
                    // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " 2ndUpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount, stt->micVol, stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 > stt->upperLimit) {
                stt->msTooHigh += 2;
                stt->msTooLow = 0;
                stt->changeToSlowMode = 0;

                if (stt->msTooHigh > stt->msecSpeechInnerChange) {
                    /* Lower the recording level */
                    stt->msTooHigh = 0;
                    /* Multiply by 0.828125 which corresponds to decreasing ~0.8dB */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 53;

                    /* Reduce the max gain to avoid excessive oscillation
                     * (but never drop below the maximum analog level).
                     */
                    stt->maxLevel = (15 * stt->maxLevel + stt->micVol) / 16;
                    stt->maxLevel = MAX(stt->maxLevel, stt->maxAnalog);

                    stt->zeroCtrlMax = stt->micVol;

                    /* 0.965 in Q15 */
                    // tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t)((uint32_t)(31621) * (uint32_t)((inMicLevelTmp - stt->minLevel))));
                    stt->micVol = (tmpU32 >> 15) + stt->minLevel;
                    if (stt->micVol > lastMicVol - 1) {
                        stt->micVol = lastMicVol - 1;
                    }
                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    // stt->numBlocksMicLvlSat = 0;
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure >"
                            " UpperLim, micVol = %d, maxLevel = %d\n",
                            stt->fcount, stt->micVol, stt->maxLevel);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerSecondaryLimit) {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechOuterChange) {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384;  // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel) {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, 32^(-2*X)/2+1.05
                     */
                    weightFIX = kOffset1[index] - (int16_t) ((kSlope1[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    // tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t) weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 2) {
                        stt->micVol = lastMicVol + 2;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    // if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150) {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure <"
                            " 2ndLowerLim, micVol = %d\n",
                            stt->fcount, stt->micVol);
#endif
                }
            } else if (stt->Rxx160_LPw32 < stt->lowerLimit) {
                stt->msTooHigh = 0;
                stt->changeToSlowMode = 0;
                stt->msTooLow += 2;

                if (stt->msTooLow > stt->msecSpeechInnerChange) {
                    /* Raise the recording level */
                    int16_t index, weightFIX;
                    int16_t volNormFIX = 16384;  // =1 in Q14.

                    stt->msTooLow = 0;

                    /* Normalize the volume level */
                    tmp32 = (inMicLevelTmp - stt->minLevel) << 14;
                    if (stt->maxInit != stt->minLevel) {
                        volNormFIX = tmp32 / (stt->maxInit - stt->minLevel);
                    }

                    /* Find correct curve */
                    WebRtcAgc_ExpCurve(volNormFIX, &index);

                    /* Compute weighting factor for the volume increase, (3.^(-2.*X))/8+1
                     */
                    weightFIX = kOffset2[index] - (int16_t) ((kSlope2[index] * volNormFIX) >> 13);

                    /* stt->Rxx160_LPw32 *= 1.047 [~0.2 dB]; */
                    stt->Rxx160_LPw32 = (stt->Rxx160_LPw32 / 64) * 67;

                    //   tmp32 = inMicLevelTmp - stt->minLevel;
                    tmpU32 = ((uint32_t) weightFIX * (uint32_t)(inMicLevelTmp - stt->minLevel));
                    stt->micVol = (tmpU32 >> 14) + stt->minLevel;
                    if (stt->micVol < lastMicVol + 1) {
                        stt->micVol = lastMicVol + 1;
                    }

                    inMicLevelTmp = stt->micVol;

#ifdef MIC_LEVEL_FEEDBACK
                    /* Count ms in level saturation */
                    // if (stt->micVol > stt->maxAnalog) {
                    if (stt->micVol > 150) {
                        /* mic level is saturated */
                        stt->numBlocksMicLvlSat++;
                        fprintf(stderr, "Sat mic Level: %d\n", stt->numBlocksMicLvlSat);
                    }
#endif
#ifdef WEBRTC_AGC_DEBUG_DUMP
                    fprintf(stt->fpt,
                            "\tAGC->ProcessAnalog, frame %d: measure < LowerLim, micVol "
                            "= %d\n",
                            stt->fcount, stt->micVol);
#endif
                }
            } else {
                /* The signal is inside the desired range which is:
                 * lowerLimit < Rxx160_LP/640 < upperLimit
                 */
                if (stt->changeToSlowMode > 4000) {
                    stt->msecSpeechInnerChange = 1000;
                    stt->msecSpeechOuterChange = 500;
                    stt->upperLimit = stt->upperPrimaryLimit;
                    stt->lowerLimit = stt->lowerPrimaryLimit;
                } else {
                    stt->changeToSlowMode += 2;  // in milliseconds
                }
                stt->msTooLow = 0;
                stt->msTooHigh = 0;

                stt->micVol = inMicLevelTmp;
            }
#ifdef MIC_LEVEL_FEEDBACK
            if (stt->numBlocksMicLvlSat > NUM_BLOCKS_IN_SAT_BEFORE_CHANGE_TARGET) {
                stt->micLvlSat = 1;
                fprintf(stderr, "target before = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
                WebRtcAgc_UpdateAgcThresholds(stt);
                WebRtcAgc_CalculateGainTable(&(stt->digitalAgc.gainTable[0]), stt->compressionGaindB,
                                             stt->targetLevelDbfs, stt->limiterEnable, stt->analogTarget);
                stt->numBlocksMicLvlSat = 0;
                stt->micLvlSat = 0;
                fprintf(stderr, "target offset = %d\n", stt->targetIdxOffset);
                fprintf(stderr, "target after  = %d (%d)\n", stt->analogTargetLevel, stt->targetIdx);
            }
#endif
        }
    }

    /* Ensure gain is not increased in presence of echo or after a mute event
     * (but allow the zeroCtrl() increase on the frame of a mute detection).
     */
    if (echo == 1 || (stt->muteGuardMs > 0 && stt->muteGuardMs < kMuteGuardTimeMs)) {
        if (stt->micVol > lastMicVol) {
            stt->micVol = lastMicVol;
        }
    }

    /* limit the gain */
    if (stt->micVol > stt->maxLevel) {
        stt->micVol = stt->maxLevel;
    } else if (stt->micVol < stt->minOutput) {
        stt->micVol = stt->minOutput;
    }

    *outMicLevel = MIN(stt->micVol, stt->maxAnalog) >> stt->scale;

    return 0;
}